

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canon_perftest.cc
# Opt level: O2

int main(void)

{
  int iVar1;
  int64_t iVar2;
  int64_t iVar3;
  ulong uVar4;
  long lVar5;
  int j;
  int iVar6;
  int iVar7;
  char *pcVar8;
  size_t i;
  char *pcVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  bool bVar13;
  float fVar14;
  int delta;
  vector<int,_std::allocator<int>_> times;
  uint64_t slash_bits;
  size_t len;
  char buf [200];
  
  times.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  times.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  times.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  len = 0x4e;
  pcVar8 = "../../third_party/WebKit/Source/WebCore/platform/leveldb/LevelDBWriteBatch.cpp";
  pcVar9 = buf;
  for (lVar5 = 0x4f; lVar5 != 0; lVar5 = lVar5 + -1) {
    *pcVar9 = *pcVar8;
    pcVar8 = pcVar8 + 1;
    pcVar9 = pcVar9 + 1;
  }
  for (iVar6 = 0; iVar6 != 5; iVar6 = iVar6 + 1) {
    iVar2 = GetTimeMillis();
    iVar12 = 2000000;
    while (bVar13 = iVar12 != 0, iVar12 = iVar12 + -1, bVar13) {
      CanonicalizePath(buf,&len,&slash_bits);
    }
    iVar3 = GetTimeMillis();
    delta = (int)iVar3 - (int)iVar2;
    std::vector<int,_std::allocator<int>_>::push_back(&times,&delta);
  }
  iVar6 = *times.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  uVar4 = (long)times.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)times.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start >> 2;
  fVar14 = 0.0;
  iVar12 = iVar6;
  for (uVar10 = 0; uVar4 != uVar10; uVar10 = uVar10 + 1) {
    iVar1 = times.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar10];
    iVar11 = iVar6;
    if (iVar6 < iVar1) {
      iVar11 = iVar1;
    }
    iVar7 = iVar12;
    if (iVar1 < iVar12) {
      iVar7 = iVar1;
    }
    fVar14 = fVar14 + (float)iVar1;
    if (iVar12 <= iVar1) {
      iVar6 = iVar11;
    }
    iVar12 = iVar7;
  }
  printf("min %dms  max %dms  avg %.1fms\n",SUB84((double)(fVar14 / (float)uVar4),0));
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&times.super__Vector_base<int,_std::allocator<int>_>);
  return 0;
}

Assistant:

int main() {
  vector<int> times;

  char buf[200];
  size_t len = strlen(kPath);
  strcpy(buf, kPath);

  for (int j = 0; j < 5; ++j) {
    const int kNumRepetitions = 2000000;
    int64_t start = GetTimeMillis();
    uint64_t slash_bits;
    for (int i = 0; i < kNumRepetitions; ++i) {
      CanonicalizePath(buf, &len, &slash_bits);
    }
    int delta = (int)(GetTimeMillis() - start);
    times.push_back(delta);
  }

  int min = times[0];
  int max = times[0];
  float total = 0;
  for (size_t i = 0; i < times.size(); ++i) {
    total += times[i];
    if (times[i] < min)
      min = times[i];
    else if (times[i] > max)
      max = times[i];
  }

  printf("min %dms  max %dms  avg %.1fms\n",
         min, max, total / times.size());
}